

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::value::matrix4d> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::matrix4d>
          (optional<tinyusdz::value::matrix4d> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  long lVar2;
  matrix4d *pmVar3;
  double *pdVar4;
  storage_t<tinyusdz::value::matrix4d> *psVar5;
  PrimVar *this_00;
  byte bVar6;
  matrix4d value;
  
  bVar6 = 0;
  this_00 = &this->_var;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    value.m[0][0] = 1.0;
    value.m[0][1] = 0.0;
    value.m[0][2] = 0.0;
    value.m[0][3] = 0.0;
    value.m[1][0] = 0.0;
    value.m[1][1] = 1.0;
    value.m[1][2] = 0.0;
    value.m[1][3] = 0.0;
    value.m[2][0] = 0.0;
    value.m[2][1] = 0.0;
    value.m[2][2] = 1.0;
    value.m[2][3] = 0.0;
    value.m[3][0] = 0.0;
    value.m[3][1] = 0.0;
    value.m[3][2] = 0.0;
    value.m[3][3] = 1.0;
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4d>
                      (this_00,t,interp,&value);
    if (bVar1) {
      pmVar3 = &value;
      psVar5 = &__return_storage_ptr__->contained;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(double *)psVar5 = pmVar3->m[0][0];
        pmVar3 = (matrix4d *)((long)pmVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        psVar5 = (storage_t<tinyusdz::value::matrix4d> *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      bVar1 = true;
    }
    else {
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x70) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x78) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x60) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x68) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x50) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x58) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x40) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
      *(undefined8 *)&__return_storage_ptr__->contained = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
      bVar1 = false;
    }
    __return_storage_ptr__->has_value_ = bVar1;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::matrix4d>
              ((optional<tinyusdz::value::matrix4d> *)&value,this_00);
    __return_storage_ptr__->has_value_ = (bool)value.m[0][0]._0_1_;
    if ((bool)value.m[0][0]._0_1_ == true) {
      pdVar4 = value.m[0] + 1;
      psVar5 = &__return_storage_ptr__->contained;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(double *)psVar5 = *pdVar4;
        pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
        psVar5 = (storage_t<tinyusdz::value::matrix4d> *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }